

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void scan_jump_targets(function *fn)

{
  int iVar1;
  uint uVar2;
  Instruction *pIVar3;
  int iVar4;
  int j_1;
  int sbx;
  int j;
  int C;
  OpCode op;
  Instruction i;
  int n;
  int pc;
  Instruction *code;
  function *fn_local;
  
  pIVar3 = fn->p->code;
  iVar1 = fn->p->sizecode;
  if (fn->jmps == (uchar *)0x0) {
    __assert_fail("fn->jmps != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ravi_jitshared.c"
                  ,0x2b0,"void scan_jump_targets(struct function *)");
  }
  i = 0;
  do {
    if (iVar1 <= (int)i) {
      return;
    }
    uVar2 = pIVar3[(int)i];
    switch(uVar2 & 0xff) {
    case 3:
      if ((uVar2 >> 0x10 & 0xff) != 0) {
        if (iVar1 <= (int)(i + 2)) {
          __assert_fail("j < n",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ravi_jitshared.c"
                        ,0x2b9,"void scan_jump_targets(struct function *)");
        }
        fn->jmps[(int)(i + 2)] = '\x01';
      }
      break;
    default:
      break;
    case 0x1e:
    case 0x27:
    case 0x28:
    case 0x2a:
    case 0x56:
    case 0x57:
    case 0x58:
    case 0x59:
      iVar4 = (uVar2 >> 0x10) + i + -0x7fff;
      if (iVar1 <= iVar4) {
        __assert_fail("j < n",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ravi_jitshared.c"
                      ,0x2c7,"void scan_jump_targets(struct function *)");
      }
      fn->jmps[iVar4] = '\x01';
    }
    i = i + 1;
  } while( true );
}

Assistant:

static void scan_jump_targets(struct function *fn) {
  const Instruction *code = fn->p->code;
  int pc, n = fn->p->sizecode;
  assert(fn->jmps != NULL);
  for (pc = 0; pc < n; pc++) {
    Instruction i = code[pc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_LOADBOOL: {
        int C = GETARG_C(i);
        if (C) {
          int j = pc + 2;  // jump target
          assert(j < n);
          fn->jmps[j] = true;
        }
      } break;
      case OP_JMP:
      case OP_RAVI_FORPREP_IP:
      case OP_RAVI_FORPREP_I1:
      case OP_RAVI_FORLOOP_IP:
      case OP_RAVI_FORLOOP_I1:
      case OP_FORLOOP:
      case OP_FORPREP:
      case OP_TFORLOOP: {
        int sbx = GETARG_sBx(i);
        int j = sbx + pc + 1;
        assert(j < n);
        fn->jmps[j] = true;
      } break;
      default:
        break;
    }
  }
}